

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

Binary * i2p::DecodeI2PBase64(Binary *__return_storage_ptr__,string *i2p_b64)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  string_view str;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_88;
  char local_70;
  string local_68;
  string local_48;
  Binary *local_28;
  
  local_28 = *(Binary **)(in_FS_OFFSET + 0x28);
  SwapBase64(&local_48,i2p_b64);
  str._M_str = local_48._M_dataplus._M_p;
  str._M_len = local_48._M_string_length;
  DecodeBase64((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &local_88._M_value,str);
  if (local_70 == '\0') {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_68,(tinyformat *)"Cannot decode Base64: \"%s\"",(char *)i2p_b64,in_RCX);
    std::runtime_error::runtime_error(this,(string *)&local_68);
    if (*(Binary **)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (*(Binary **)(in_FS_OFFSET + 0x28) == local_28) {
      return *(Binary **)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

static Binary DecodeI2PBase64(const std::string& i2p_b64)
{
    const std::string& std_b64 = SwapBase64(i2p_b64);
    auto decoded = DecodeBase64(std_b64);
    if (!decoded) {
        throw std::runtime_error(strprintf("Cannot decode Base64: \"%s\"", i2p_b64));
    }
    return std::move(*decoded);
}